

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QHybrid.cpp
# Opt level: O0

void __thiscall QHybrid::ComputeQ(QHybrid *this)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  PlanningUnit *this_00;
  size_t sVar4;
  reference pdVar5;
  ulong uVar6;
  long *in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double exp_fut_R;
  double prob_s_1;
  double r_s_ja_1;
  BeliefIteratorGeneric it_1;
  double exp_imm_R;
  double prob_s;
  double r_s_ja;
  BeliefIteratorGeneric it;
  double Q;
  Index newJAI;
  size_t empty_jaohI;
  bool last_t;
  JointBeliefInterface *b0;
  JointBeliefInterface *b0p;
  size_t time_step;
  Index in_stack_00000254;
  LIndex in_stack_00000258;
  size_t in_stack_00000260;
  QHybrid *in_stack_00000268;
  size_type in_stack_fffffffffffffeb8;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffec0;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  E *in_stack_fffffffffffffef0;
  undefined1 local_88 [16];
  ulong local_78;
  double local_70;
  double local_68;
  undefined1 local_60 [16];
  PlanningUnitDecPOMDPDiscrete *local_50;
  uint local_44;
  undefined8 local_40;
  byte local_31;
  JointBeliefInterface *local_30;
  JointBeliefInterface *local_28;
  long local_20;
  
  lVar2 = (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                    ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  if (lVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x28);
    E::E(in_stack_fffffffffffffef0,
         (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    __cxa_throw(uVar3,&E::typeinfo,E::~E);
  }
  local_20 = 0;
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  local_30 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_fffffffffffffed0);
  lVar2 = local_20;
  local_31 = 0;
  local_28 = local_30;
  this_00 = (PlanningUnit *)
            (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                      ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  sVar4 = PlanningUnit::GetHorizon(this_00);
  if (lVar2 == sVar4 - in_RDI[9]) {
    local_31 = 1;
  }
  if ((local_31 & 1) == 0) {
    local_40 = 0;
    local_44 = 0;
    while( true ) {
      uVar6 = (ulong)local_44;
      (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                ((long)in_RDI + *(long *)(*in_RDI + -0x88));
      sVar4 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x8a3d42);
      if (sVar4 <= uVar6) break;
      local_50 = (PlanningUnitDecPOMDPDiscrete *)0x0;
      if ((local_31 & 1) == 0) {
        local_78 = 0;
        (**(code **)(*(long *)((long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8)) +
                    0x98))(local_88,(long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8))
        ;
        do {
          (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                    ((long)in_RDI + *(long *)(*in_RDI + -0x88));
          BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8a3f58);
          dVar7 = PlanningUnitDecPOMDPDiscrete::GetReward
                            (in_stack_fffffffffffffec0,(Index)(in_stack_fffffffffffffeb8 >> 0x20),
                             (Index)in_stack_fffffffffffffeb8);
          auVar9._0_8_ = BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8a3f97);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = dVar7;
          auVar9._8_8_ = 0;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_78;
          auVar9 = vfmadd213sd_fma(auVar9,auVar12,auVar15);
          local_78 = auVar9._0_8_;
          bVar1 = BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8a3fe4);
        } while (bVar1);
        auVar10._0_8_ =
             ComputeRecursively(in_stack_00000268,in_stack_00000260,in_stack_00000258,
                                in_stack_00000254);
        uVar6 = local_78;
        (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                  ((long)in_RDI + *(long *)(*in_RDI + -0x88));
        dVar7 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x8a406e);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar7;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar6;
        auVar10._8_8_ = 0;
        auVar9 = vfmadd213sd_fma(auVar10,auVar13,auVar16);
        local_50 = auVar9._0_8_;
        BeliefIteratorGeneric::~BeliefIteratorGeneric
                  ((BeliefIteratorGeneric *)in_stack_fffffffffffffec0);
      }
      else if (in_RDI[8] == 0) {
        (**(code **)(*(long *)((long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8)) +
                    0x98))(local_60,(long)&local_30->field_0x0 + *(long *)((long)*local_30 + -0xb8))
        ;
        do {
          (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
                    ((long)in_RDI + *(long *)(*in_RDI + -0x88));
          BeliefIteratorGeneric::GetStateIndex((BeliefIteratorGeneric *)0x8a3e11);
          local_68 = PlanningUnitDecPOMDPDiscrete::GetReward
                               (in_stack_fffffffffffffec0,(Index)(in_stack_fffffffffffffeb8 >> 0x20)
                                ,(Index)in_stack_fffffffffffffeb8);
          auVar8._0_8_ = BeliefIteratorGeneric::GetProbability((BeliefIteratorGeneric *)0x8a3e50);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = local_68;
          auVar8._8_8_ = 0;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_50;
          auVar9 = vfmadd213sd_fma(auVar8,auVar11,auVar14);
          local_50 = auVar9._0_8_;
          local_70 = auVar8._0_8_;
          bVar1 = BeliefIteratorGeneric::Next((BeliefIteratorGeneric *)0x8a3e9d);
        } while (bVar1);
        BeliefIteratorGeneric::~BeliefIteratorGeneric
                  ((BeliefIteratorGeneric *)in_stack_fffffffffffffec0);
      }
      else {
        local_50 = (PlanningUnitDecPOMDPDiscrete *)
                   (**(code **)(*(long *)in_RDI[8] + 0x70))((long *)in_RDI[8],local_30,0,local_44);
      }
      in_stack_fffffffffffffec0 = local_50;
      pdVar5 = boost::numeric::ublas::
               matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               ::operator()((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                             *)local_50,in_stack_fffffffffffffeb8,0x8a4100);
      *pdVar5 = (double)in_stack_fffffffffffffec0;
      local_44 = local_44 + 1;
    }
    if (local_28 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)*local_28 + 8))();
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffef0,
       (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  __cxa_throw(uVar3,&E::typeinfo,E::~E);
}

Assistant:

void QHybrid::ComputeQ()
{
    if(GetPU() == 0)
        throw E("QHybrid::ComputeQ - GetPU() returns 0; no PlanningUnit available!");

    size_t time_step = 0;
    JointBeliefInterface* b0p = GetPU()->GetNewJointBeliefFromISD(); 
    JointBeliefInterface& b0 =  *b0p;
    
    bool last_t = false;
    if( (time_step) == (GetPU()->GetHorizon() -
                        _m_horizonLastTimeSteps))
        last_t = true;

    if(last_t)
        throw E("QHybrid::ComputeQ - last_t is true, not possible");


    size_t empty_jaohI = 0;
    for(Index newJAI=0; newJAI < GetPU()->GetNrJointActions(); newJAI++)
    {
        double Q=0.0;
        if(last_t)
        {
            if(_m_QlastTimeSteps)
                Q = _m_QlastTimeSteps->GetQ(b0,
                                            Globals::INITIAL_JAOHI,
                                            newJAI);
            else
            {
                BeliefIteratorGeneric it=b0.GetIterator();
                do
                {
                    double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                    double prob_s = it.GetProbability();
                    Q += r_s_ja * prob_s;
                } while(it.Next());
                
            }
        }
        else
        {
            //calculate R(joah',newJA) - expected immediate reward for time_step
            double exp_imm_R = 0.0;
            BeliefIteratorGeneric it=b0.GetIterator();
            do
            {
                double r_s_ja = GetPU()->GetReward(it.GetStateIndex(), newJAI);
                double prob_s = it.GetProbability();
                exp_imm_R += r_s_ja * prob_s;
            } while(it.Next());

            double exp_fut_R = ComputeRecursively( 1, Globals::INITIAL_JAOHI, newJAI);

            Q = exp_imm_R + GetPU()->GetDiscount() * exp_fut_R;
        }
        _m_QValuesFirstTimeSteps(empty_jaohI,newJAI)=Q;
    }//end for newJAI

    delete b0p;
    return;
}